

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Doctor.cpp
# Opt level: O0

void __thiscall
Doctor::Doctor(Doctor *this,string *id,string *name,string *last_Name,string *phone_number,
              string *user_name,string *password,string *age,string *field,string *day,string *time,
              string *visited_patients)

{
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string *local_38;
  string *user_name_local;
  string *phone_number_local;
  string *last_Name_local;
  string *name_local;
  string *id_local;
  Doctor *this_local;
  
  local_38 = user_name;
  user_name_local = phone_number;
  phone_number_local = last_Name;
  last_Name_local = name;
  name_local = id;
  id_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)id);
  std::__cxx11::string::string(local_78,(string *)name);
  std::__cxx11::string::string(local_a8,(string *)last_Name);
  std::__cxx11::string::string(local_c8,(string *)phone_number);
  std::__cxx11::string::string(local_e8,(string *)user_name);
  std::__cxx11::string::string(local_108,(string *)password);
  std::__cxx11::string::string(local_128,(string *)age);
  Human::Human(&this->super_Human,(string *)local_58,(string *)local_78,(string *)local_a8,
               (string *)local_c8,(string *)local_e8,(string *)local_108,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string((string *)&this->Day);
  std::__cxx11::string::string((string *)&this->Time);
  std::__cxx11::string::string((string *)&this->Field);
  std::__cxx11::string::string((string *)&this->Visited_Patients);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->doctor_all_ino);
  std::__cxx11::string::operator=((string *)&this->Field,(string *)field);
  std::__cxx11::string::operator=((string *)&this->Day,(string *)day);
  std::__cxx11::string::operator=((string *)&this->Time,(string *)time);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,id);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,last_Name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,phone_number);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,user_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,password);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,age);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,field);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,day);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,time);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->doctor_all_ino,visited_patients);
  return;
}

Assistant:

Doctor::Doctor(string id, string name, string last_Name, string phone_number, string user_name, string password, string age, string field, string day, string time, string visited_patients)
    :Human{ id,name,last_Name,phone_number,user_name,password,age } {
    Field = field;
    Day = day;
    Time = time;
    doctor_all_ino.push_back(id);
    doctor_all_ino.push_back(name);
    doctor_all_ino.push_back(last_Name);
    doctor_all_ino.push_back(phone_number);
    doctor_all_ino.push_back(user_name);
    doctor_all_ino.push_back(password);
    doctor_all_ino.push_back(age);
    doctor_all_ino.push_back(field);
    doctor_all_ino.push_back(day);
    doctor_all_ino.push_back(time);
    doctor_all_ino.push_back(visited_patients);
}